

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O3

void pnga_pgroup_sync(Integer grp_id)

{
  int proc;
  int group_rank;
  
  if (grp_id < 1) {
    ARMCI_AllFence();
  }
  else if (0 < PGRP_LIST[grp_id].map_nproc) {
    group_rank = 0;
    do {
      proc = ARMCI_Absolute_id(&PGRP_LIST[grp_id].group,group_rank);
      ARMCI_Fence(proc);
      group_rank = group_rank + 1;
    } while (group_rank < PGRP_LIST[grp_id].map_nproc);
  }
  pnga_msg_pgroup_sync(grp_id);
  if (GA_fence_set != 0) {
    memset(fence_array,0,(long)(int)GAnproc);
  }
  GA_fence_set = 0;
  return;
}

Assistant:

void pnga_pgroup_sync(Integer grp_id)
{
#ifdef CHECK_MA
  Integer status;
#endif

  /*    printf("p[%d] calling ga_pgroup_sync on group: %d\n",GAme,*grp_id); */
#ifdef USE_ARMCI_GROUP_FENCE
    int grp = (int)grp_id;
    ARMCI_GroupFence(&grp);
    pnga_msg_pgroup_sync(grp_id);
#else
  if (grp_id > 0) {
#   ifdef MSG_COMMS_MPI
    /* fence on all processes in this group */
    { int p; for(p=0;p<PGRP_LIST[grp_id].map_nproc;p++)
      ARMCI_Fence(ARMCI_Absolute_id(&PGRP_LIST[grp_id].group, p)); }
    pnga_msg_pgroup_sync(grp_id);
    if(GA_fence_set)bzero(fence_array,(int)GAnproc);
    GA_fence_set=0;
#   else
    pnga_error("ga_pgroup_sync_(): MPI not defined. ga_msg_pgroup_sync_()  can be called only if GA is built with MPI", 0);
#   endif
  } else {
    /* printf("p[%d] calling regular sync in ga_pgroup_sync\n",GAme); */
    ARMCI_AllFence();
    pnga_msg_pgroup_sync(grp_id);
    if(GA_fence_set)bzero(fence_array,(int)GAnproc);
    GA_fence_set=0;
  }
#endif
#ifdef CHECK_MA
  status = MA_verify_allocator_stuff();
#endif
}